

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O0

void __thiscall
itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::small_vector
          (small_vector<int,_4UL,_0UL,_std::allocator<int>_> *this,size_t count,int *value,
          allocator<int> *alloc)

{
  small_vector<int,_4UL,_0UL,_std::allocator<int>_> *in_RCX;
  allocator<int> *in_RDX;
  small_vector<int,_4UL,_0UL,_std::allocator<int>_> *in_RSI;
  int *in_stack_ffffffffffffffd0;
  size_type in_stack_ffffffffffffffd8;
  
  small_vector(in_RSI,in_RDX);
  assign_impl(in_RCX,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  return;
}

Assistant:

explicit small_vector(size_t count, const T& value, const Alloc& alloc = Alloc())
        : small_vector(alloc)
    {
        assign_impl(count, value);
    }